

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

CTcCodeLabel * __thiscall
CTPNCodeBody::add_named_arg_tab(CTPNCodeBody *this,CTcNamedArgs *named_args)

{
  CTcNamedArgTab *pCVar1;
  CTcCodeLabel *pCVar2;
  
  pCVar1 = (CTcNamedArgTab *)CTcPrsMem::alloc(G_prsmem,0x20);
  pCVar1->arglist = named_args->args;
  pCVar1->cnt = named_args->cnt;
  pCVar2 = CTcCodeStream::new_label_fwd(G_cs);
  pCVar1->lbl = pCVar2;
  pCVar1->nxt = (CTcNamedArgTab *)0x0;
  pCVar1->nxt = this->named_arg_tables_;
  this->named_arg_tables_ = pCVar1;
  return pCVar1->lbl;
}

Assistant:

CTcCodeLabel *CTPNCodeBody::add_named_arg_tab(const CTcNamedArgs *named_args)
{
    /* allocate the tracking object */
    CTcNamedArgTab *tab = new (G_prsmem) CTcNamedArgTab(named_args);

    /* link it into our list */
    tab->nxt = named_arg_tables_;
    named_arg_tables_ = tab;

    /* return the code label for the table */
    return tab->lbl;
}